

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtFindFirstDiffBit(word *pIn1,word *pIn2,int nVars)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  
  bVar1 = (char)nVars - 6U & 0x1f;
  uVar3 = 0;
  uVar2 = 1 << bVar1;
  if (1 << bVar1 < 1) {
    uVar2 = uVar3;
  }
  uVar7 = (ulong)uVar2;
  if (nVars < 7) {
    uVar7 = 1;
  }
  uVar5 = 0;
  while( true ) {
    if (uVar7 == uVar5) {
      return -1;
    }
    if (pIn1[uVar5] != pIn2[uVar5]) break;
    uVar5 = uVar5 + 1;
    uVar3 = uVar3 - 0x40;
  }
  uVar5 = pIn2[uVar5] ^ pIn1[uVar5];
  bVar8 = (int)uVar5 == 0;
  uVar7 = uVar5 >> 0x20;
  if (!bVar8) {
    uVar7 = uVar5;
  }
  iVar4 = (uint)bVar8 * 0x20;
  iVar6 = iVar4 + 0x10;
  uVar5 = uVar7 >> 0x10;
  if ((short)uVar7 != 0) {
    iVar6 = iVar4;
    uVar5 = uVar7;
  }
  iVar4 = iVar6 + 8;
  uVar7 = uVar5 >> 8;
  if ((char)uVar5 != '\0') {
    iVar4 = iVar6;
    uVar7 = uVar5;
  }
  iVar6 = iVar4 + 4;
  uVar5 = uVar7 >> 4;
  if ((uVar7 & 0xf) != 0) {
    iVar6 = iVar4;
    uVar5 = uVar7;
  }
  uVar2 = (uint)(uVar5 >> 2) & 0x3fffffff;
  iVar4 = iVar6 + 2;
  if ((uVar5 & 3) != 0) {
    uVar2 = (uint)uVar5;
    iVar4 = iVar6;
  }
  return ((~uVar2 & 1) + iVar4) - uVar3;
}

Assistant:

static inline int Abc_TtFindFirstDiffBit( word * pIn1, word * pIn2, int nVars )
{
    int w, nWords = Abc_TtWordNum(nVars);
    for ( w = 0; w < nWords; w++ )
        if ( pIn1[w] ^ pIn2[w] )
            return 64*w + Abc_Tt6FirstBit(pIn1[w] ^ pIn2[w]);
    return -1;
}